

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example_specific.cpp
# Opt level: O2

int main(void)

{
  stCoEpoll_t *ctx;
  stCoRoutine_t **ppco;
  int i;
  long lVar1;
  stRoutineArgs_t args [10];
  stCoRoutine_t *local_b8;
  undefined4 local_b0 [38];
  
  ppco = &local_b8;
  for (lVar1 = 0; lVar1 != 10; lVar1 = lVar1 + 1) {
    *(int *)(ppco + 1) = (int)lVar1;
    co_create(ppco,(stCoRoutineAttr_t *)0x0,RoutineFunc,ppco);
    co_resume(*ppco);
    ppco = ppco + 2;
  }
  ctx = co_get_epoll_ct();
  co_eventloop(ctx,(pfn_co_eventloop_t)0x0,(void *)0x0);
  return 0;
}

Assistant:

int main()
{
	stRoutineArgs_t args[10];
	for (int i = 0; i < 10; i++)
	{
		args[i].routine_id = i;
		co_create(&args[i].co, NULL, RoutineFunc, (void*)&args[i]);
		co_resume(args[i].co);
	}
	co_eventloop(co_get_epoll_ct(), NULL, NULL);
	return 0;
}